

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O1

int Ssw_ClassesPrepareRehash(Ssw_Cla_t *p,Vec_Ptr_t *vCands,int fConstCorr)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t **ppAVar2;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  uint uVar5;
  void *__ptr;
  void *__ptr_00;
  int iVar6;
  Aig_Obj_t *pAVar7;
  long lVar8;
  long lVar9;
  Aig_Obj_t **ppAVar10;
  ulong uVar11;
  uint uVar12;
  int local_40;
  
  uVar5 = vCands->nSize / 2 - 1;
  while( true ) {
    do {
      uVar12 = uVar5 + 1;
      uVar4 = uVar5 & 1;
      uVar5 = uVar12;
    } while (uVar4 != 0);
    if (uVar12 < 9) break;
    iVar6 = 5;
    while (uVar12 % (iVar6 - 2U) != 0) {
      uVar4 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar12 < uVar4) goto LAB_0091711e;
    }
  }
LAB_0091711e:
  __ptr = calloc((long)(int)uVar12,8);
  __ptr_00 = calloc((long)p->pAig->vObjs->nSize,8);
  p->nCands1 = 0;
  local_40 = 0;
  if (0 < vCands->nSize) {
    lVar8 = 0;
    local_40 = 0;
    do {
      pAVar1 = (Aig_Obj_t *)vCands->pArray[lVar8];
      if (p->pClassSizes[pAVar1->Id] != 0) {
        __assert_fail("p->pClassSizes[pObj->Id] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                      ,0x205,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)");
      }
      ppAVar2 = p->pAig->pReprs;
      if (ppAVar2 == (Aig_Obj_t **)0x0) {
LAB_009173ab:
        __assert_fail("p->pReprs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      ppAVar2[pAVar1->Id] = (Aig_Obj_t *)0x0;
      iVar6 = (*p->pFuncNodeIsConst)(p->pManData,pAVar1);
      if (iVar6 == 0) {
        if (fConstCorr == 0) {
          uVar5 = (*p->pFuncNodeHash)(p->pManData,pAVar1);
          pAVar7 = *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar5 % uVar12) * 8);
          if (pAVar7 == (Aig_Obj_t *)0x0) {
            *(Aig_Obj_t **)((long)__ptr + (long)(int)(uVar5 % uVar12) * 8) = pAVar1;
          }
          else {
            ppAVar2 = p->pAig->pReprs;
            if (ppAVar2 == (Aig_Obj_t **)0x0) goto LAB_009173ab;
            ppAVar2[pAVar1->Id] = pAVar7;
            if (*(long *)((long)__ptr_00 + (long)pAVar7->Id * 8) == 0) {
              p->pClassSizes[pAVar7->Id] = p->pClassSizes[pAVar7->Id] + 1;
              local_40 = local_40 + 1;
            }
            lVar9 = (long)pAVar7->Id;
            *(undefined8 *)((long)__ptr_00 + (long)pAVar1->Id * 8) =
                 *(undefined8 *)((long)__ptr_00 + lVar9 * 8);
            *(Aig_Obj_t **)((long)__ptr_00 + lVar9 * 8) = pAVar1;
            p->pClassSizes[lVar9] = p->pClassSizes[lVar9] + 1;
            local_40 = local_40 + 1;
          }
        }
      }
      else {
        ppAVar2 = p->pAig->pReprs;
        if (ppAVar2 == (Aig_Obj_t **)0x0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = ppAVar2[pAVar1->Id];
        }
        pAVar3 = p->pAig->pConst1;
        if (pAVar7 == pAVar3) {
          __assert_fail("!Ssw_ObjIsConst1Cand( pAig, pObj )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswInt.h"
                        ,0xb2,"void Ssw_ObjSetConst1Cand(Aig_Man_t *, Aig_Obj_t *)");
        }
        if (ppAVar2 == (Aig_Obj_t **)0x0) goto LAB_009173ab;
        ppAVar2[pAVar1->Id] = pAVar3;
        p->nCands1 = p->nCands1 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vCands->nSize);
  }
  uVar11 = 0;
  if (0 < vCands->nSize) {
    lVar8 = 0;
    uVar11 = 0;
    do {
      pAVar1 = (Aig_Obj_t *)vCands->pArray[lVar8];
      lVar9 = (long)pAVar1->Id;
      uVar5 = p->pClassSizes[lVar9];
      if ((ulong)uVar5 != 0) {
        if ((int)uVar5 < 2) {
          __assert_fail("nNodes > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                        ,0x232,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)");
        }
        ppAVar2 = p->pMemClassesFree;
        ppAVar2[uVar11] = pAVar1;
        pAVar7 = *(Aig_Obj_t **)((long)__ptr_00 + lVar9 * 8);
        if (pAVar7 != (Aig_Obj_t *)0x0) {
          ppAVar10 = ppAVar2 + uVar11 + uVar5;
          do {
            ppAVar10 = ppAVar10 + -1;
            *ppAVar10 = pAVar7;
            pAVar7 = *(Aig_Obj_t **)((long)__ptr_00 + (long)pAVar7->Id * 8);
          } while (pAVar7 != (Aig_Obj_t *)0x0);
        }
        p->pClassSizes[lVar9] = 0;
        iVar6 = pAVar1->Id;
        if (p->pId2Class[iVar6] != (Aig_Obj_t **)0x0) {
          __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                        ,0x5e,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        if (ppAVar2[uVar11] != pAVar1) {
          __assert_fail("pClass[0] == pRepr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                        ,0x5f,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        p->pId2Class[iVar6] = ppAVar2 + uVar11;
        if (p->pClassSizes[iVar6] != 0) {
          __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                        ,0x61,"void Ssw_ObjAddClass(Ssw_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        p->pClassSizes[iVar6] = uVar5;
        p->nClasses = p->nClasses + 1;
        p->nLits = p->nLits + uVar5 + -1;
        uVar11 = (ulong)((int)uVar11 + uVar5);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vCands->nSize);
  }
  p->pMemClassesFree = p->pMemClassesFree + uVar11;
  if (local_40 != (int)uVar11) {
    __assert_fail("nEntries == nEntries2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswClass.c"
                  ,0x242,"int Ssw_ClassesPrepareRehash(Ssw_Cla_t *, Vec_Ptr_t *, int)");
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  iVar6 = Ssw_ClassesRefine(p,1);
  return iVar6;
}

Assistant:

int Ssw_ClassesPrepareRehash( Ssw_Cla_t * p, Vec_Ptr_t * vCands, int fConstCorr )
{
//    Aig_Man_t * pAig = p->pAig;
    Aig_Obj_t ** ppTable, ** ppNexts, ** ppClassNew;
    Aig_Obj_t * pObj, * pTemp, * pRepr;
    int i, k, nTableSize, nNodes, iEntry, nEntries, nEntries2;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Vec_PtrSize(vCands)/2 );
    ppTable = ABC_CALLOC( Aig_Obj_t *, nTableSize );
    ppNexts = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) );

    // sort through the candidates
    nEntries = 0;
    p->nCands1 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pObj, i )
    {
        assert( p->pClassSizes[pObj->Id] == 0 );
        Aig_ObjSetRepr( p->pAig, pObj, NULL );
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( p->pManData, pObj ) )
        {
            Ssw_ObjSetConst1Cand( p->pAig, pObj );
            p->nCands1++;
            continue;
        }
        if ( fConstCorr )
            continue;
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( p->pManData, pObj ) % nTableSize;
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
        {
            ppTable[iEntry] = pObj;
        }
        else
        {
            // set the representative of this node
            pRepr = ppTable[iEntry];
            Aig_ObjSetRepr( p->pAig, pObj, pRepr );
            // add node to the table
            if ( Ssw_ObjNext( ppNexts, pRepr ) == NULL )
            { // this will be the second entry
                p->pClassSizes[pRepr->Id]++;
                nEntries++;
            }
            // add the entry to the list
            Ssw_ObjSetNext( ppNexts, pObj, Ssw_ObjNext( ppNexts, pRepr ) );
            Ssw_ObjSetNext( ppNexts, pRepr, pObj );
            p->pClassSizes[pRepr->Id]++;
            nEntries++;
        }
    }

    // copy the entries into storage in the topological order
    nEntries2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vCands, pObj, i )
    {
        nNodes = p->pClassSizes[pObj->Id];
        // skip the nodes that are not representatives of non-trivial classes
        if ( nNodes == 0 )
            continue;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        ppClassNew = p->pMemClassesFree + nEntries2;
        ppClassNew[0] = pObj;
        for ( pTemp = Ssw_ObjNext(ppNexts, pObj), k = 1; pTemp;
              pTemp = Ssw_ObjNext(ppNexts, pTemp), k++ )
        {
            ppClassNew[nNodes-k] = pTemp;
        }
        // add the class of nodes
        p->pClassSizes[pObj->Id] = 0;
        Ssw_ObjAddClass( p, pObj, ppClassNew, nNodes );
        // increment the number of entries
        nEntries2 += nNodes;
    }
    p->pMemClassesFree += nEntries2;
    assert( nEntries == nEntries2 );
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    return Ssw_ClassesRefine( p, 1 );
}